

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIrrCreationParameters.h
# Opt level: O2

void __thiscall
irr::SIrrlichtCreationParameters::SIrrlichtCreationParameters(SIrrlichtCreationParameters *this)

{
  this->DeviceType = EIDT_BEST;
  this->DriverType = EDT_OPENGL;
  (this->WindowSize).Width = 800;
  (this->WindowSize).Height = 600;
  (this->WindowPosition).X = -1;
  (this->WindowPosition).Y = -1;
  this->Bits = ' ';
  this->ZBufferBits = '\x18';
  this->Fullscreen = false;
  this->WindowMaximized = false;
  this->WindowResizable = '\x02';
  this->Stencilbuffer = true;
  this->Vsync = false;
  this->AntiAlias = '\0';
  this->WithAlphaChannel = false;
  this->Doublebuffer = true;
  this->Stereobuffer = false;
  this->EventReceiver = (IEventReceiver *)0x0;
  this->WindowId = (void *)0x0;
  this->LoggingLevel = ELL_INFORMATION;
  this->SDK_version_do_not_use = "1.9.0mt15";
  this->PrivateData = (void *)0x0;
  core::string<char>::string<char>(&this->OGLES2ShaderPath,"../../media/Shaders/");
  return;
}

Assistant:

SIrrlichtCreationParameters() :
			DeviceType(EIDT_BEST),
			DriverType(video::EDT_OPENGL),
			WindowSize(core::dimension2d<u32>(800, 600)),
			WindowPosition(core::position2di(-1, -1)),
			Bits(32),
			ZBufferBits(24),
			Fullscreen(false),
			WindowMaximized(false),
			WindowResizable(2),
			Stencilbuffer(true),
			Vsync(false),
			AntiAlias(0),
			WithAlphaChannel(false),
			Doublebuffer(true),
			Stereobuffer(false),
			EventReceiver(0),
			WindowId(0),
#ifdef _DEBUG
			LoggingLevel(ELL_DEBUG),
#else
			LoggingLevel(ELL_INFORMATION),
#endif
			SDK_version_do_not_use(IRRLICHT_SDK_VERSION),
			PrivateData(0),
#ifdef IRR_MOBILE_PATHS
			OGLES2ShaderPath("media/Shaders/")
#else
			OGLES2ShaderPath("../../media/Shaders/")
#endif
	{
	}